

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,char **variable,string *value)

{
  long lVar1;
  char *pcVar2;
  char *__src;
  string *value_local;
  char **variable_local;
  CommandLineArguments *this_local;
  
  if (*variable != (char *)0x0) {
    if (*variable != (char *)0x0) {
      operator_delete__(*variable);
    }
    *variable = (char *)0x0;
  }
  lVar1 = std::__cxx11::string::size();
  pcVar2 = (char *)operator_new__(lVar1 + 1);
  *variable = pcVar2;
  pcVar2 = *variable;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar2,__src);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  char** variable, const std::string& value)
{
  if ( *variable )
    {
    delete [] *variable;
    *variable = 0;
    }
  *variable = new char[ value.size() + 1 ];
  strcpy(*variable, value.c_str());
}